

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
          (cmGeneratorExpressionEvaluationFile *this,string *input,string *target,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *outputFileExpr,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *condition,bool inputIsContent,string *newLineCharacter,mode_t permissions,
          PolicyStatus policyStatusCMP0070)

{
  bool inputIsContent_local;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *condition_local;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *outputFileExpr_local;
  string *target_local;
  string *input_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)input);
  std::__cxx11::string::string((string *)&this->Target,(string *)target);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  unique_ptr(&this->OutputFileExpr,outputFileExpr);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  unique_ptr(&this->Condition,condition);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files);
  this->InputIsContent = inputIsContent;
  std::__cxx11::string::string((string *)&this->NewLineCharacter,(string *)newLineCharacter);
  this->PolicyStatusCMP0070 = policyStatusCMP0070;
  this->Permissions = permissions;
  return;
}

Assistant:

cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile(
  std::string input, std::string target,
  std::unique_ptr<cmCompiledGeneratorExpression> outputFileExpr,
  std::unique_ptr<cmCompiledGeneratorExpression> condition,
  bool inputIsContent, std::string newLineCharacter, mode_t permissions,
  cmPolicies::PolicyStatus policyStatusCMP0070)
  : Input(std::move(input))
  , Target(std::move(target))
  , OutputFileExpr(std::move(outputFileExpr))
  , Condition(std::move(condition))
  , InputIsContent(inputIsContent)
  , NewLineCharacter(std::move(newLineCharacter))
  , PolicyStatusCMP0070(policyStatusCMP0070)
  , Permissions(permissions)
{
}